

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

reference<mpt::layout::graph::transform3> * __thiscall
mpt::reference<mpt::layout::graph::transform3>::operator=
          (reference<mpt::layout::graph::transform3> *this,
          reference<mpt::layout::graph::transform3> *ref)

{
  transform3 *ptVar1;
  transform3 *ptVar2;
  uintptr_t uVar3;
  
  ptVar1 = ref->_ref;
  ref->_ref = (transform3 *)0x0;
  ptVar2 = this->_ref;
  if (ptVar2 != (transform3 *)0x0) {
    uVar3 = refcount::lower(&(ptVar2->super_type)._ref);
    if (uVar3 == 0) {
      (*(ptVar2->super_type).super_transform._vptr_transform[5])(ptVar2);
    }
  }
  this->_ref = ptVar1;
  return this;
}

Assistant:

inline reference & operator= (reference &&ref)
	{
		T *r = ref._ref;
		ref._ref = 0;
		set_instance(r);
		return *this;
	}